

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_frame.cc
# Opt level: O1

pair<bool,_std::unique_ptr<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_>_>
__thiscall pstack::Dwarf::CFI::putFDEorCIE(CFI *this,DWARFReader *reader)

{
  csptr *pcVar1;
  element_type *peVar2;
  CFI **ppCVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  _func_int *endOff_;
  FDE *this_00;
  DWARFReader *in_RDX;
  FDE *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  _Head_base<0UL,_pstack::Dwarf::FDE_*,_false> _Var5;
  __uniq_ptr_data<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>,_true,_true>
  extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  bool bVar7;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_pstack::Dwarf::CIE>_>,_bool> pVar8;
  pair<bool,_std::unique_ptr<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_>_> pVar9;
  _func_int *local_90;
  _Head_base<0UL,_unsigned_long_&,_false> local_88;
  CFI *local_80;
  tuple<const_pstack::Dwarf::CFI_*&&,_pstack::Dwarf::DWARFReader_&,_unsigned_long_&> local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  undefined4 local_58;
  char local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  _Head_base<2UL,_unsigned_long_&,_false> local_40;
  Off associatedCIE;
  
  peVar2 = (element_type *)in_RDX->off;
  endOff_ = (_func_int *)
            decodeCIEFDEHdr((CFI *)reader,in_RDX,(FIType)reader[1].off,
                            (Off *)&stack0xffffffffffffffc0);
  if (endOff_ == (_func_int *)0x0) {
    *(undefined1 *)
     &(this->io).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr = 0;
    _Var5._M_head_impl = extraout_RDX;
  }
  else {
    if ((_func_int **)local_40._M_head_impl != (_func_int **)0xffffffffffffffff) {
      pcVar1 = &reader[1].io;
      p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pcVar1;
      for (p_Var6 = reader[1].io.
                    super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                    ._M_pi; p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   (&p_Var6[1]._vptr__Sp_counted_base)[bVar7]) {
        bVar7 = p_Var6[2]._vptr__Sp_counted_base < local_40._M_head_impl;
        if (!bVar7) {
          p_Var4 = p_Var6;
        }
      }
      p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pcVar1;
      if ((p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pcVar1) &&
         (p_Var6 = p_Var4, local_40._M_head_impl < p_Var4[2]._vptr__Sp_counted_base)) {
        p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pcVar1;
      }
      if (p_Var6 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pcVar1) {
        ppCVar3 = (CFI **)reader->off;
        associatedCIE = reader->end;
        if (associatedCIE != 0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)(associatedCIE + 8) = *(int *)(associatedCIE + 8) + 1;
            UNLOCK();
          }
          else {
            *(int *)(associatedCIE + 8) = *(int *)(associatedCIE + 8) + 1;
          }
        }
        local_78.
        super__Tuple_impl<0UL,_const_pstack::Dwarf::CFI_*&&,_pstack::Dwarf::DWARFReader_&,_unsigned_long_&>
        .super__Tuple_impl<1UL,_pstack::Dwarf::DWARFReader_&,_unsigned_long_&>.
        super__Tuple_impl<2UL,_unsigned_long_&>.super__Head_base<2UL,_unsigned_long_&,_false>.
        _M_head_impl = (_Head_base<2UL,_unsigned_long_&,_false>)
                       (_Head_base<2UL,_unsigned_long_&,_false>)local_40._M_head_impl;
        local_78.
        super__Tuple_impl<0UL,_const_pstack::Dwarf::CFI_*&&,_pstack::Dwarf::DWARFReader_&,_unsigned_long_&>
        .super__Tuple_impl<1UL,_pstack::Dwarf::DWARFReader_&,_unsigned_long_&>.
        super__Head_base<1UL,_pstack::Dwarf::DWARFReader_&,_false>._M_head_impl =
             (DWARFReader *)
             (*(code *)((*ppCVar3)->cies)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)
                       (ppCVar3);
        local_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)associatedCIE;
        local_58 = 8;
        local_78.
        super__Tuple_impl<0UL,_const_pstack::Dwarf::CFI_*&&,_pstack::Dwarf::DWARFReader_&,_unsigned_long_&>
        .super__Head_base<0UL,_const_pstack::Dwarf::CFI_*&&,_false>._M_head_impl = ppCVar3;
        putFDEorCIE((CFI *)&stack0xffffffffffffffb0,reader);
        if ((local_50 != '\x01') ||
           (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
          __assert_fail("success && notAnFde == nullptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/dwarf_frame.cc"
                        ,0x7a,
                        "std::pair<bool, std::unique_ptr<FDE>> pstack::Dwarf::CFI::putFDEorCIE(DWARFReader &) const"
                       );
        }
        if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
        }
      }
      this_00 = (FDE *)operator_new(0x40);
      FDE::FDE(this_00,(CFI *)reader,in_RDX,(Off)local_40._M_head_impl,(Off)endOff_);
      if ((_func_int *)in_RDX->end < endOff_) goto LAB_00138e9a;
      in_RDX->off = (Off)endOff_;
      *(undefined1 *)
       &(this->io).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr = 1;
      (this->io).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00;
      _Var5._M_head_impl =
           (FDE *)extraout_RDX_00.
                  super___uniq_ptr_impl<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_pstack::Dwarf::FDE_*,_std::default_delete<pstack::Dwarf::FDE>_>
                  .super__Head_base<0UL,_pstack::Dwarf::FDE_*,_false>._M_head_impl;
      goto LAB_00138e88;
    }
    local_88._M_head_impl = (unsigned_long *)&stack0xffffffffffffffb0;
    local_78.
    super__Tuple_impl<0UL,_const_pstack::Dwarf::CFI_*&&,_pstack::Dwarf::DWARFReader_&,_unsigned_long_&>
    .super__Tuple_impl<1UL,_pstack::Dwarf::DWARFReader_&,_unsigned_long_&>.
    super__Tuple_impl<2UL,_unsigned_long_&>.super__Head_base<2UL,_unsigned_long_&,_false>.
    _M_head_impl = (_Head_base<2UL,_unsigned_long_&,_false>)&local_90;
    local_78.
    super__Tuple_impl<0UL,_const_pstack::Dwarf::CFI_*&&,_pstack::Dwarf::DWARFReader_&,_unsigned_long_&>
    .super__Head_base<0UL,_const_pstack::Dwarf::CFI_*&&,_false>._M_head_impl = &local_80;
    local_90 = endOff_;
    local_80 = (CFI *)reader;
    local_78.
    super__Tuple_impl<0UL,_const_pstack::Dwarf::CFI_*&&,_pstack::Dwarf::DWARFReader_&,_unsigned_long_&>
    .super__Tuple_impl<1UL,_pstack::Dwarf::DWARFReader_&,_unsigned_long_&>.
    super__Head_base<1UL,_pstack::Dwarf::DWARFReader_&,_false>._M_head_impl = in_RDX;
    _local_50 = peVar2;
    pVar8 = std::
            _Rb_tree<unsigned_long,std::pair<unsigned_long_const,pstack::Dwarf::CIE>,std::_Select1st<std::pair<unsigned_long_const,pstack::Dwarf::CIE>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,pstack::Dwarf::CIE>>>
            ::
            _M_emplace_unique<std::piecewise_construct_t_const&,std::tuple<unsigned_long&>,std::tuple<pstack::Dwarf::CFI_const*&&,pstack::Dwarf::DWARFReader&,unsigned_long&>>
                      ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,pstack::Dwarf::CIE>,std::_Select1st<std::pair<unsigned_long_const,pstack::Dwarf::CIE>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,pstack::Dwarf::CIE>>>
                        *)&reader[1].end,(piecewise_construct_t *)&std::piecewise_construct,
                       (tuple<unsigned_long_&> *)&local_88,&local_78);
    _Var5._M_head_impl = pVar8._8_8_;
    if ((_func_int *)in_RDX->end < endOff_) {
LAB_00138e9a:
      __assert_fail("end >= off_",
                    "/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/libpstack/dwarf.h"
                    ,0x3b2,"void pstack::Dwarf::DWARFReader::setOffset(Elf::Off)");
    }
    in_RDX->off = (Off)endOff_;
    *(undefined1 *)
     &(this->io).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr = 1;
  }
  (this->io).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_00138e88:
  pVar9.second._M_t.
  super___uniq_ptr_impl<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>_>._M_t.
  super__Tuple_impl<0UL,_pstack::Dwarf::FDE_*,_std::default_delete<pstack::Dwarf::FDE>_>.
  super__Head_base<0UL,_pstack::Dwarf::FDE_*,_false>._M_head_impl =
       (__uniq_ptr_data<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>,_true,_true>)
       (__uniq_ptr_data<pstack::Dwarf::FDE,_std::default_delete<pstack::Dwarf::FDE>,_true,_true>)
       _Var5._M_head_impl;
  pVar9._0_8_ = this;
  return pVar9;
}

Assistant:

std::pair<bool, std::unique_ptr<FDE>>
CFI::putFDEorCIE( DWARFReader &reader ) const {
   size_t startOffset = reader.getOffset();
   Elf::Off associatedCIE;
   Elf::Off nextoff = decodeCIEFDEHdr(reader, type, &associatedCIE);
   if (nextoff == 0)
      return { false, nullptr };
   if (associatedCIE == Elf::Off(-1)) {
      putCIE(startOffset, reader, nextoff);
      reader.setOffset( nextoff );
      return { true, nullptr };
   } else {
      if (cies.find(associatedCIE) == cies.end()) {
         DWARFReader r2( io, associatedCIE );
         auto [ success, notAnFde ] = putFDEorCIE(r2);
         assert(success && notAnFde == nullptr);
      }
      std::unique_ptr<FDE> fde = std::make_unique<FDE>(*this, reader, associatedCIE, nextoff);
      reader.setOffset( nextoff );
      return {true, std::move(fde) };
   }
}